

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QCursor>::emplace<QCursor_const&>
          (QMovableArrayOps<QCursor> *this,qsizetype i,QCursor *args)

{
  qsizetype *pqVar1;
  QCursor **ppQVar2;
  Data *pDVar3;
  QCursor *pQVar4;
  QCursor *pQVar5;
  QCursor QVar6;
  QCursor *__dest;
  long in_FS_OFFSET;
  bool bVar7;
  QCursor tmp;
  Inserter local_60;
  QCursor local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_002dfc78:
    local_38.d = (QCursorData *)&DAT_aaaaaaaaaaaaaaaa;
    QCursor::QCursor(&local_38,args);
    bVar7 = (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size != 0;
    QArrayDataPointer<QCursor>::detachAndGrow
              ((QArrayDataPointer<QCursor> *)this,(uint)(i == 0 && bVar7),1,(QCursor **)0x0,
               (QArrayDataPointer<QCursor> *)0x0);
    QVar6.d = local_38.d;
    if (i == 0 && bVar7) {
      pQVar4 = (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr;
      local_38.d = (QCursorData *)0x0;
      pQVar4[-1].d = QVar6.d;
      (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr = pQVar4 + -1;
      pqVar1 = &(this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size;
      *pqVar1 = *pqVar1 + 1;
    }
    else {
      pQVar5 = (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr;
      pQVar4 = pQVar5 + i;
      __dest = pQVar4 + 1;
      local_60.nInserts = 1;
      local_60.bytes =
           ((this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size - i) * 8;
      local_60.data = (QArrayDataPointer<QCursor> *)this;
      local_60.displaceTo = __dest;
      memmove(__dest,pQVar5 + i,local_60.bytes);
      QVar6.d = local_38.d;
      local_38.d = (QCursorData *)0x0;
      pQVar4->d = QVar6.d;
      local_60.displaceFrom = __dest;
      Inserter::~Inserter(&local_60);
    }
    QCursor::~QCursor(&local_38);
  }
  else {
    if (((this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size == i) &&
       (pQVar4 = (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr,
       (pDVar3->super_QArrayData).alloc !=
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
       i)) {
      QCursor::QCursor(pQVar4 + i,args);
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr,
         (QCursor *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         pQVar4)) goto LAB_002dfc78;
      QCursor::QCursor(pQVar4 + -1,args);
      ppQVar2 = &(this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.ptr;
      *ppQVar2 = *ppQVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QCursor>).super_QArrayDataPointer<QCursor>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }